

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::TableSetupDrawChannels(ImGuiTable *table)

{
  ImGuiTableDrawChannelIdx IVar1;
  ImGuiWindow *pIVar2;
  ImGuiTableDrawChannelIdx IVar3;
  int iVar4;
  ImGuiTableColumn *pIVar5;
  bool bVar6;
  char local_50;
  ImGuiTableDrawChannelIdx local_48;
  ImGuiTableDrawChannelIdx local_44;
  int local_3c;
  ImGuiTableColumn *column;
  int column_n;
  int draw_channel_current;
  int channels_total;
  int channels_for_dummy;
  int channels_for_bg;
  int channels_for_row;
  int freeze_row_multiplier;
  ImGuiTable *table_local;
  
  iVar4 = 1;
  if ('\0' < table->FreezeRowsCount) {
    iVar4 = 2;
  }
  if ((table->Flags & 0x100000U) == 0) {
    local_3c = (int)table->ColumnsEnabledCount;
  }
  else {
    local_3c = 1;
  }
  bVar6 = true;
  if (table->ColumnsCount <= (int)table->ColumnsEnabledCount) {
    bVar6 = table->VisibleMaskByIndex != table->EnabledMaskByIndex;
  }
  iVar4 = iVar4 + 1 + local_3c * iVar4 + (uint)bVar6;
  ImDrawListSplitter::Split(table->DrawSplitter,table->InnerWindow->DrawList,iVar4);
  if (bVar6 == 0) {
    local_44 = 0xff;
  }
  else {
    local_44 = (char)iVar4 + 0xff;
  }
  table->DummyDrawChannel = local_44;
  table->Bg2DrawChannelCurrent = '\x01';
  if (table->FreezeRowsCount < '\x01') {
    local_48 = '\x01';
  }
  else {
    local_48 = (char)local_3c + '\x02';
  }
  table->Bg2DrawChannelUnfrozen = local_48;
  IVar3 = '\x02';
  for (column._4_4_ = 0; column._4_4_ < table->ColumnsCount; column._4_4_ = column._4_4_ + 1) {
    pIVar5 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,column._4_4_);
    if (((pIVar5->IsVisibleX & 1U) == 0) || ((pIVar5->IsVisibleY & 1U) == 0)) {
      IVar1 = table->DummyDrawChannel;
      pIVar5->DrawChannelUnfrozen = IVar1;
      pIVar5->DrawChannelFrozen = IVar1;
    }
    else {
      pIVar5->DrawChannelFrozen = IVar3;
      if (table->FreezeRowsCount < '\x01') {
        local_50 = '\0';
      }
      else {
        local_50 = (char)local_3c + '\x01';
      }
      pIVar5->DrawChannelUnfrozen = IVar3 + local_50;
      if ((table->Flags & 0x100000U) == 0) {
        IVar3 = IVar3 + '\x01';
      }
    }
    pIVar5->DrawChannelCurrent = pIVar5->DrawChannelFrozen;
  }
  (table->BgClipRect).Min = (table->InnerClipRect).Min;
  (table->BgClipRect).Max = (table->InnerClipRect).Max;
  pIVar2 = table->OuterWindow;
  (table->Bg0ClipRectForDrawCmd).Min = (pIVar2->ClipRect).Min;
  (table->Bg0ClipRectForDrawCmd).Max = (pIVar2->ClipRect).Max;
  (table->Bg2ClipRectForDrawCmd).Min = (table->HostClipRect).Min;
  (table->Bg2ClipRectForDrawCmd).Max = (table->HostClipRect).Max;
  if ((table->BgClipRect).Min.y <= (table->BgClipRect).Max.y) {
    return;
  }
  __assert_fail("table->BgClipRect.Min.y <= table->BgClipRect.Max.y",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_tables.cpp"
                ,0x8e6,"void ImGui::TableSetupDrawChannels(ImGuiTable *)");
}

Assistant:

void ImGui::TableSetupDrawChannels(ImGuiTable* table)
{
    const int freeze_row_multiplier = (table->FreezeRowsCount > 0) ? 2 : 1;
    const int channels_for_row = (table->Flags & ImGuiTableFlags_NoClip) ? 1 : table->ColumnsEnabledCount;
    const int channels_for_bg = 1 + 1 * freeze_row_multiplier;
    const int channels_for_dummy = (table->ColumnsEnabledCount < table->ColumnsCount || table->VisibleMaskByIndex != table->EnabledMaskByIndex) ? +1 : 0;
    const int channels_total = channels_for_bg + (channels_for_row * freeze_row_multiplier) + channels_for_dummy;
    table->DrawSplitter->Split(table->InnerWindow->DrawList, channels_total);
    table->DummyDrawChannel = (ImGuiTableDrawChannelIdx)((channels_for_dummy > 0) ? channels_total - 1 : -1);
    table->Bg2DrawChannelCurrent = TABLE_DRAW_CHANNEL_BG2_FROZEN;
    table->Bg2DrawChannelUnfrozen = (ImGuiTableDrawChannelIdx)((table->FreezeRowsCount > 0) ? 2 + channels_for_row : TABLE_DRAW_CHANNEL_BG2_FROZEN);

    int draw_channel_current = 2;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        ImGuiTableColumn* column = &table->Columns[column_n];
        if (column->IsVisibleX && column->IsVisibleY)
        {
            column->DrawChannelFrozen = (ImGuiTableDrawChannelIdx)(draw_channel_current);
            column->DrawChannelUnfrozen = (ImGuiTableDrawChannelIdx)(draw_channel_current + (table->FreezeRowsCount > 0 ? channels_for_row + 1 : 0));
            if (!(table->Flags & ImGuiTableFlags_NoClip))
                draw_channel_current++;
        }
        else
        {
            column->DrawChannelFrozen = column->DrawChannelUnfrozen = table->DummyDrawChannel;
        }
        column->DrawChannelCurrent = column->DrawChannelFrozen;
    }

    // Initial draw cmd starts with a BgClipRect that matches the one of its host, to facilitate merge draw commands by default.
    // All our cell highlight are manually clipped with BgClipRect. When unfreezing it will be made smaller to fit scrolling rect.
    // (This technically isn't part of setting up draw channels, but is reasonably related to be done here)
    table->BgClipRect = table->InnerClipRect;
    table->Bg0ClipRectForDrawCmd = table->OuterWindow->ClipRect;
    table->Bg2ClipRectForDrawCmd = table->HostClipRect;
    IM_ASSERT(table->BgClipRect.Min.y <= table->BgClipRect.Max.y);
}